

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::CheckVariable(char *ptr,ExternTypeInfo *type)

{
  ExternTypeInfo *type_00;
  
  type_00 = type;
  if ((type->typeFlags & 4) != 0) {
    type_00 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                        ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                         *(uint *)ptr);
  }
  if (type_00->pointerCount != 0) {
    switch(type->subCat) {
    case CAT_ARRAY:
      CheckArray(ptr,type);
      return;
    case CAT_POINTER:
      CheckPointer(ptr);
      return;
    case CAT_FUNCTION:
      CheckFunction(ptr);
      return;
    case CAT_CLASS:
      CheckClass(ptr,type_00);
      return;
    }
  }
  return;
}

Assistant:

void CheckVariable(char* ptr, const ExternTypeInfo& type)
	{
		const ExternTypeInfo *realType = &type;

		if(type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE)
			realType = &NULLC::commonLinker->exTypes[*(int*)ptr];

		if(!realType->pointerCount)
			return;

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
			break;
		case ExternTypeInfo::CAT_ARRAY:
			CheckArray(ptr, type);
			break;
		case ExternTypeInfo::CAT_POINTER:
			CheckPointer(ptr);
			break;
		case ExternTypeInfo::CAT_FUNCTION:
			CheckFunction(ptr);
			break;
		case ExternTypeInfo::CAT_CLASS:
			CheckClass(ptr, *realType);
			break;
		}
	}